

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfHeader.h
# Opt level: O0

TypedAttribute<double> * __thiscall
Imf_3_2::Header::typedAttribute<Imf_3_2::TypedAttribute<double>>(Header *this,char *name)

{
  Attribute *pAVar1;
  TypeExc *this_00;
  TypedAttribute<double> *tattr;
  Attribute *attr;
  char *in_stack_00000278;
  Header *in_stack_00000280;
  TypedAttribute<double> *local_40;
  
  pAVar1 = operator[](in_stack_00000280,in_stack_00000278);
  if (pAVar1 == (Attribute *)0x0) {
    local_40 = (TypedAttribute<double> *)0x0;
  }
  else {
    local_40 = (TypedAttribute<double> *)
               __dynamic_cast(pAVar1,&Attribute::typeinfo,&TypedAttribute<double>::typeinfo,0);
  }
  if (local_40 == (TypedAttribute<double> *)0x0) {
    this_00 = (TypeExc *)__cxa_allocate_exception(0x48);
    Iex_3_2::TypeExc::TypeExc(this_00,"Unexpected attribute type.");
    __cxa_throw(this_00,&Iex_3_2::TypeExc::typeinfo,Iex_3_2::TypeExc::~TypeExc);
  }
  return local_40;
}

Assistant:

T&
Header::typedAttribute (const char name[])
{
    Attribute* attr  = &(*this)[name];
    T*         tattr = dynamic_cast<T*> (attr);

    if (tattr == 0) throw IEX_NAMESPACE::TypeExc ("Unexpected attribute type.");

    return *tattr;
}